

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_onewaycouple_mri.c
# Opt level: O3

int err(N_Vector y,N_Vector ytrue,sunrealtype *e)

{
  int iVar1;
  sunrealtype extraout_XMM0_Qa;
  
  N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,y,ytrue,ytrue);
  iVar1 = N_VMaxNorm(ytrue);
  *e = extraout_XMM0_Qa;
  return iVar1;
}

Assistant:

static int err(N_Vector y, N_Vector ytrue, sunrealtype* e)
{
  /* compute the error and store it in ytrue */
  N_VLinearSum(SUN_RCONST(1.0), y, SUN_RCONST(-1.0), ytrue, ytrue);

  /* compute the max norm of the error */
  *e = N_VMaxNorm(ytrue);

  /* return with success */
  return (0);
}